

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

void Gia_ManSweepComputeOneDomainEquivs
               (Gia_Man_t *p,Vec_Int_t *vRegClasses,int iDom,void *pParsS,int fConst,int fEquiv,
               int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Gia_Man_t *p_01;
  uint *puVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = vRegClasses->nSize;
  uVar9 = (ulong)uVar1;
  if (uVar9 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *vRegClasses->pArray;
    if (1 < (int)uVar1) {
      uVar6 = 1;
      do {
        iVar7 = vRegClasses->pArray[uVar6];
        if (iVar3 <= iVar7) {
          iVar3 = iVar7;
        }
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
  }
  if ((iDom < 1) || (iVar3 < iDom)) {
    __assert_fail("iDom >= 1 && iDom <= nDoms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x265,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x266,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  uVar2 = p->nRegs;
  if ((int)uVar2 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x267,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0x10 < uVar2) {
    uVar6 = (ulong)uVar2;
  }
  p_00->nSize = 0;
  p_00->nCap = (int)uVar6;
  piVar4 = (int *)malloc(uVar6 << 2);
  p_00->pArray = piVar4;
  if ((int)uVar1 < 1) {
    iVar3 = 0;
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    do {
      if (vRegClasses->pArray[lVar8] != iDom) {
        Vec_IntPush(p_00,(int)lVar8);
        uVar9 = (ulong)(uint)vRegClasses->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar9);
    iVar3 = p_00->nSize;
    iVar7 = iVar3;
    if (0 < (int)uVar9) {
      lVar8 = 0;
      do {
        if (vRegClasses->pArray[lVar8] == iDom) {
          Vec_IntPush(p_00,(int)lVar8);
          uVar9 = (ulong)(uint)vRegClasses->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)uVar9);
      iVar7 = p_00->nSize;
    }
  }
  if (iVar7 != p->nRegs) {
    __assert_fail("Vec_IntSize(vPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x272,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_01 = Gia_ManDupPermFlop(p,p_00);
  if (p_01->nObjs != p->nObjs) {
    __assert_fail("Gia_ManObjNum(pNew) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x275,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  p_01->nRegs = iVar7 - iVar3;
  if (pParsS == (void *)0x0) {
    Gia_ManSeqCleanupClasses(p_01,fConst,fEquiv,fVerbose);
  }
  else {
    Cec_ManLSCorrespondenceClasses(p_01,(Cec_ParCor_t *)pParsS);
  }
  p_01->nRegs = p->nRegs;
  uVar1 = p->nObjs;
  if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar5 = &p->pObjs->Value;
    lVar8 = 0;
    do {
      uVar2 = *puVar5;
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((uVar2 & 1) != 0) {
        __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x281,
                      "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                     );
      }
      if (p_01->nObjs <= (int)(uVar2 >> 1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p_01->pObjs[uVar2 >> 1].Value = (uint)lVar8;
      lVar8 = lVar8 + 2;
      puVar5 = puVar5 + 3;
    } while ((ulong)uVar1 * 2 != lVar8);
  }
  Gia_ManDupRemapEquiv(p,p_01);
  Gia_ManStop(p_01);
  return;
}

Assistant:

void Gia_ManSweepComputeOneDomainEquivs( Gia_Man_t * p, Vec_Int_t * vRegClasses, int iDom, void * pParsS, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPerm;
    int i, Class, nFlops;
    int nDoms = Vec_IntFindMax(vRegClasses);
    assert( iDom >= 1 && iDom <= nDoms );
    assert( p->pManTime == NULL );
    assert( Gia_ManRegNum(p) > 0 );
    // create required flop permutation
    vPerm = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class != iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize( vPerm );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class == iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize(vPerm) - nFlops;
    assert( Vec_IntSize(vPerm) == Gia_ManRegNum(p) );
    // derive new AIG
    pNew = Gia_ManDupPermFlop( p, vPerm );
    assert( Gia_ManObjNum(pNew) == Gia_ManObjNum(p) );
    Vec_IntFree( vPerm );
    // perform computation of equivalences 
    pNew->nRegs = nFlops;
    if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pNew, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pNew, fConst, fEquiv, fVerbose );
    pNew->nRegs = Gia_ManRegNum(p);
    // make new point to old
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( !Abc_LitIsCompl(pObj->Value) );
        Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Abc_Var2Lit(i, 0);
    }
    // transfer
    Gia_ManDupRemapEquiv( p, pNew );
    Gia_ManStop( pNew );
}